

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O0

UINT8 device_start_sn76496_maxim(SN76496_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 SamplingRate;
  UINT8 UVar1;
  UINT8 UVar2;
  undefined2 uVar3;
  SN76489_Context *noisechip;
  UINT32 rate;
  DEV_DATA *devData;
  SN76489_Context *chip;
  DEV_INFO *retDevInf_local;
  SN76496_CFG *cfg_local;
  
  SamplingRate = (cfg->_genCfg).smplRate;
  noisechip = SN76489_Init((cfg->_genCfg).clock,SamplingRate);
  if (noisechip == (SN76489_Context *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    UVar1 = (cfg->_genCfg).srMode;
    UVar2 = (cfg->_genCfg).flags;
    uVar3 = *(undefined2 *)&(cfg->_genCfg).field_0x6;
    (noisechip->cfg)._genCfg.emuCore = (cfg->_genCfg).emuCore;
    (noisechip->cfg)._genCfg.srMode = UVar1;
    (noisechip->cfg)._genCfg.flags = UVar2;
    *(undefined2 *)&(noisechip->cfg)._genCfg.field_0x6 = uVar3;
    *(undefined8 *)((long)&noisechip->cfg + 8) = *(undefined8 *)&(cfg->_genCfg).clock;
    *(undefined8 *)((long)&noisechip->cfg + 0x10) = *(undefined8 *)&cfg->noiseTaps;
    *(void **)((long)&noisechip->cfg + 0x18) = cfg->t6w28_tone;
    if (cfg->t6w28_tone != (void *)0x0) {
      SN76489_ConnectT6W28(noisechip,(SN76489_Context *)cfg->t6w28_tone);
    }
    SN76489_Config(noisechip,(uint)cfg->noiseTaps,cfg->shiftRegWidth);
    noisechip->_devData = (DEV_DATA)noisechip;
    INIT_DEVINF(retDevInf,&noisechip->_devData,SamplingRate,&devDef_SN76489_Maxim);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_sn76496_maxim(const SN76496_CFG* cfg, DEV_INFO* retDevInf)
{
	SN76489_Context* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->_genCfg.smplRate;
	chip = SN76489_Init(cfg->_genCfg.clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	chip->cfg = *cfg;
	if (cfg->t6w28_tone != NULL)
		SN76489_ConnectT6W28(chip, (SN76489_Context*)cfg->t6w28_tone);
	SN76489_Config(chip, cfg->noiseTaps, cfg->shiftRegWidth);
	
	devData = &chip->_devData;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_SN76489_Maxim);
	return 0x00;
}